

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

s32 __thiscall
irr::core::string<unsigned_short>::findFirst(string<unsigned_short> *this,unsigned_short c)

{
  int local_20;
  s32 i;
  unsigned_short c_local;
  string<unsigned_short> *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->used <= local_20) {
      return -1;
    }
    if (this->array[local_20] == c) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

s32 findFirst(T c) const
	{
		for (s32 i=0; i<used; ++i)
			if (array[i] == c)
				return i;

		return -1;
	}